

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Enum::clear_source_context(Enum *this)

{
  SourceContext *this_00;
  void *pvVar1;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if ((pvVar1 == (void *)0x0) && (this_00 = this->source_context_, this_00 != (SourceContext *)0x0))
  {
    SourceContext::~SourceContext(this_00);
    operator_delete(this_00);
  }
  this->source_context_ = (SourceContext *)0x0;
  return;
}

Assistant:

void Enum::clear_source_context() {
  if (GetArena() == nullptr && source_context_ != nullptr) {
    delete source_context_;
  }
  source_context_ = nullptr;
}